

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::Command*>,long_long>
               (reverse_iterator<VkSpecParser::Command_*> first,longlong n,
               reverse_iterator<VkSpecParser::Command_*> d_first)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  TypedName *pTVar5;
  int *piVar6;
  Command *pCVar7;
  Command *pCVar8;
  Command *pCVar9;
  Command *pCVar10;
  Command *pCVar11;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (Command *)((d_first.current)->cmd).name.d.d;
  pCVar10 = local_58.end.current + -n;
  pCVar9 = (Command *)((first.current)->cmd).name.d.d;
  pCVar8 = local_58.end.current;
  pCVar7 = pCVar10;
  pCVar11 = pCVar9;
  if (pCVar10 < pCVar9) {
    pCVar7 = pCVar9;
    pCVar11 = pCVar10;
  }
  while (local_58.intermediate.current = pCVar8, pCVar8 != pCVar7) {
    pDVar1 = pCVar9[-1].cmd.name.d.d;
    pCVar9[-1].cmd.name.d.d = (Data *)0x0;
    pCVar8[-1].cmd.name.d.d = pDVar1;
    pcVar2 = pCVar9[-1].cmd.name.d.ptr;
    pCVar9[-1].cmd.name.d.ptr = (char16_t *)0x0;
    pCVar8[-1].cmd.name.d.ptr = pcVar2;
    qVar3 = pCVar9[-1].cmd.name.d.size;
    pCVar9[-1].cmd.name.d.size = 0;
    pCVar8[-1].cmd.name.d.size = qVar3;
    pDVar1 = pCVar9[-1].cmd.type.d.d;
    pCVar9[-1].cmd.type.d.d = (Data *)0x0;
    pCVar8[-1].cmd.type.d.d = pDVar1;
    pcVar2 = pCVar9[-1].cmd.type.d.ptr;
    pCVar9[-1].cmd.type.d.ptr = (char16_t *)0x0;
    pCVar8[-1].cmd.type.d.ptr = pcVar2;
    qVar3 = pCVar9[-1].cmd.type.d.size;
    pCVar9[-1].cmd.type.d.size = 0;
    pCVar8[-1].cmd.type.d.size = qVar3;
    pDVar1 = pCVar9[-1].cmd.typeSuffix.d.d;
    pCVar9[-1].cmd.typeSuffix.d.d = (Data *)0x0;
    pCVar8[-1].cmd.typeSuffix.d.d = pDVar1;
    pcVar2 = pCVar9[-1].cmd.typeSuffix.d.ptr;
    pCVar9[-1].cmd.typeSuffix.d.ptr = (char16_t *)0x0;
    pCVar8[-1].cmd.typeSuffix.d.ptr = pcVar2;
    qVar3 = pCVar9[-1].cmd.typeSuffix.d.size;
    pCVar9[-1].cmd.typeSuffix.d.size = 0;
    pCVar8[-1].cmd.typeSuffix.d.size = qVar3;
    pDVar4 = pCVar9[-1].args.d.d;
    pCVar9[-1].args.d.d = (Data *)0x0;
    pCVar8[-1].args.d.d = pDVar4;
    pTVar5 = pCVar9[-1].args.d.ptr;
    pCVar9[-1].args.d.ptr = (TypedName *)0x0;
    pCVar8[-1].args.d.ptr = pTVar5;
    qVar3 = pCVar9[-1].args.d.size;
    pCVar9[-1].args.d.size = 0;
    pCVar8[-1].args.d.size = qVar3;
    pCVar8[-1].deviceLevel = pCVar9[-1].deviceLevel;
    ((d_first.current)->cmd).name.d.d =
         (Data *)&((d_first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
    pCVar9 = (Command *)&((first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
    ((first.current)->cmd).name.d.d = (Data *)pCVar9;
    pCVar8 = (Command *)((d_first.current)->cmd).name.d.d;
  }
  while (pCVar8 != pCVar10) {
    pDVar1 = pCVar8[-1].cmd.name.d.d;
    pCVar8[-1].cmd.name.d.d = pCVar9[-1].cmd.name.d.d;
    pCVar9[-1].cmd.name.d.d = pDVar1;
    pcVar2 = pCVar8[-1].cmd.name.d.ptr;
    pCVar8[-1].cmd.name.d.ptr = pCVar9[-1].cmd.name.d.ptr;
    pCVar9[-1].cmd.name.d.ptr = pcVar2;
    qVar3 = pCVar8[-1].cmd.name.d.size;
    pCVar8[-1].cmd.name.d.size = pCVar9[-1].cmd.name.d.size;
    pCVar9[-1].cmd.name.d.size = qVar3;
    pDVar1 = pCVar8[-1].cmd.type.d.d;
    pCVar8[-1].cmd.type.d.d = pCVar9[-1].cmd.type.d.d;
    pCVar9[-1].cmd.type.d.d = pDVar1;
    pcVar2 = pCVar8[-1].cmd.type.d.ptr;
    pCVar8[-1].cmd.type.d.ptr = pCVar9[-1].cmd.type.d.ptr;
    pCVar9[-1].cmd.type.d.ptr = pcVar2;
    qVar3 = pCVar8[-1].cmd.type.d.size;
    pCVar8[-1].cmd.type.d.size = pCVar9[-1].cmd.type.d.size;
    pCVar9[-1].cmd.type.d.size = qVar3;
    pDVar1 = pCVar8[-1].cmd.typeSuffix.d.d;
    pCVar8[-1].cmd.typeSuffix.d.d = pCVar9[-1].cmd.typeSuffix.d.d;
    pCVar9[-1].cmd.typeSuffix.d.d = pDVar1;
    pcVar2 = pCVar8[-1].cmd.typeSuffix.d.ptr;
    pCVar8[-1].cmd.typeSuffix.d.ptr = pCVar9[-1].cmd.typeSuffix.d.ptr;
    pCVar9[-1].cmd.typeSuffix.d.ptr = pcVar2;
    qVar3 = pCVar8[-1].cmd.typeSuffix.d.size;
    pCVar8[-1].cmd.typeSuffix.d.size = pCVar9[-1].cmd.typeSuffix.d.size;
    pCVar9[-1].cmd.typeSuffix.d.size = qVar3;
    QArrayDataPointer<VkSpecParser::TypedName>::operator=(&pCVar8[-1].args.d,&pCVar9[-1].args.d);
    pCVar8[-1].deviceLevel = pCVar9[-1].deviceLevel;
    ((d_first.current)->cmd).name.d.d =
         (Data *)&((d_first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
    pCVar9 = (Command *)&((first.current)->cmd).name.d.d[-7].super_QArrayData.alloc;
    ((first.current)->cmd).name.d.d = (Data *)pCVar9;
    pCVar8 = (Command *)((d_first.current)->cmd).name.d.d;
  }
  local_58.iter = &local_58.end;
  while (pCVar9 != pCVar11) {
    ((first.current)->cmd).name.d.d = (Data *)(pCVar9 + 1);
    QArrayDataPointer<VkSpecParser::TypedName>::~QArrayDataPointer(&(pCVar9->args).d);
    pDVar1 = (pCVar9->cmd).typeSuffix.d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pCVar9->cmd).typeSuffix.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar1 = (pCVar9->cmd).type.d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pCVar9->cmd).type.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar6 = *(int **)&(pCVar9->cmd).name.d.d;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pCVar9->cmd).name.d.d,2,0x10);
      }
    }
    pCVar9 = (Command *)((first.current)->cmd).name.d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::Command_*>,_long_long>::
  Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}